

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator<
               (List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                *c1,List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  Column_support *pCVar5;
  
  if (c1 == c2) {
    return false;
  }
  pCVar5 = &c2->column_;
  p_Var3 = (_List_node_base *)pCVar5;
  p_Var4 = (_List_node_base *)&c1->column_;
  do {
    p_Var4 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    p_Var3 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if ((p_Var4 == (_List_node_base *)&c1->column_) || (p_Var3 == (_List_node_base *)pCVar5)) {
      return p_Var3 != (_List_node_base *)pCVar5;
    }
    uVar1 = *(uint *)((long)p_Var3[1]._M_next + 0x18);
    uVar2 = *(uint *)((long)p_Var4[1]._M_next + 0x18);
    if (uVar2 != uVar1) {
      return uVar2 < uVar1;
    }
    uVar1 = *(uint *)((long)p_Var3[1]._M_next + 4);
    uVar2 = *(uint *)((long)p_Var4[1]._M_next + 4);
  } while (uVar2 == uVar1);
  return uVar2 < uVar1;
}

Assistant:

bool operator<(const List_column& c1, const List_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }